

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O0

sexp_conflict sexp_error_string(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict x)

{
  undefined1 auVar1 [16];
  int *piVar2;
  char *pcVar3;
  sexp_conflict psVar4;
  ulong in_RCX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  int err;
  int local_2c;
  
  if (in_RCX == 0x3e) {
    piVar2 = __errno_location();
    local_2c = *piVar2;
  }
  else {
    if ((in_RCX & 1) != 1) {
      psVar4 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,2,in_RCX);
      return psVar4;
    }
    auVar1._8_8_ = (long)in_RCX >> 0x3f;
    auVar1._0_8_ = in_RCX & 0xfffffffffffffffe;
    local_2c = SUB164(auVar1 / SEXT816(2),0);
  }
  pcVar3 = strerror(local_2c);
  psVar4 = (sexp_conflict)sexp_c_string(in_RDI,pcVar3,0xffffffffffffffff);
  return psVar4;
}

Assistant:

sexp sexp_error_string (sexp ctx, sexp self, sexp_sint_t n, sexp x) {
#ifdef PLAN9
  return SEXP_FALSE;
#else
  int err;
  if (x == SEXP_FALSE) {
    err = errno;
  } else {
    sexp_assert_type(ctx, sexp_fixnump, SEXP_FIXNUM, x);
    err = sexp_unbox_fixnum(x);
  }
  return sexp_c_string(ctx, strerror(err), -1);
#endif
}